

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O2

void __thiscall
capnp::EzRpcServer::Impl::Impl
          (Impl *this,Client *mainInterface,StringPtr bindAddress,uint defaultPort,
          ReaderOptions readerOpts)

{
  _Rb_tree_header *p_Var1;
  ClientHook *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  PromiseFulfillerPair<unsigned_int> paf;
  undefined1 local_98 [16];
  Own<kj::_::PromiseNode> local_88;
  PromiseFulfillerPair<unsigned_int> local_78;
  Own<kj::_::ForkHub<unsigned_int>_> local_58;
  int local_48;
  Own<kj::PromiseFulfiller<unsigned_int>_> local_40;
  
  (this->super_SturdyRefRestorer<capnp::AnyPointer>).super_SturdyRefRestorerBase.
  _vptr_SturdyRefRestorerBase = (_func_int **)&PTR_baseRestore_00672f60;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_00672f88;
  pCVar2 = (mainInterface->hook).ptr;
  (this->mainInterface).hook.disposer = (mainInterface->hook).disposer;
  (this->mainInterface).hook.ptr = pCVar2;
  (mainInterface->hook).ptr = (ClientHook *)0x0;
  EzRpcContext::getThreadLocal();
  p_Var1 = &(this->exportMap)._M_t._M_impl.super__Rb_tree_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->portPromise).hub.disposer = (Disposer *)0x0;
  (this->portPromise).hub.ptr = (ForkHub<unsigned_int> *)0x0;
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler);
  kj::newPromiseAndFulfiller<unsigned_int>();
  kj::Promise<unsigned_int>::fork((Promise<unsigned_int> *)&local_58);
  kj::Own<kj::_::ForkHub<unsigned_int>_>::operator=(&(this->portPromise).hub,&local_58);
  kj::Own<kj::_::ForkHub<unsigned_int>_>::dispose(&local_58);
  iVar3 = (*((((this->context).ptr)->ioContext).provider.ptr)->_vptr_AsyncIoProvider[3])();
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar3))
            (local_98,(undefined8 *)CONCAT44(extraout_var,iVar3),bindAddress.content.ptr,
             bindAddress.content.size_,defaultPort);
  local_48 = readerOpts.nestingLimit;
  local_58.ptr = (ForkHub<unsigned_int> *)readerOpts.traversalLimitInWords;
  local_40.disposer = local_78.fulfiller.disposer;
  local_40.ptr = local_78.fulfiller.ptr;
  local_78.fulfiller.ptr = (PromiseFulfiller<unsigned_int> *)0x0;
  local_58.disposer = (Disposer *)this;
  kj::Promise<kj::Own<kj::NetworkAddress>>::
  then<kj::CaptureByMove<capnp::EzRpcServer::Impl::Impl(capnp::Capability::Client,kj::StringPtr,unsigned_int,capnp::ReaderOptions)::_lambda(kj::Own<kj::PromiseFulfiller<unsigned_int>>&&,kj::Own<kj::NetworkAddress>&&)_1_,kj::Own<kj::PromiseFulfiller<unsigned_int>>>,kj::_::PropagateException>
            ((Promise<kj::Own<kj::NetworkAddress>> *)(local_98 + 0x10),
             (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_ez_rpc_c__:264:11),_kj::Own<kj::PromiseFulfiller<unsigned_int>_>_>
              *)local_98,(PropagateException *)&local_58);
  kj::TaskSet::add(&this->tasks,(Promise<void> *)(local_98 + 0x10));
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_98 + 0x10));
  kj::Own<kj::PromiseFulfiller<unsigned_int>_>::dispose(&local_40);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_98);
  kj::PromiseFulfillerPair<unsigned_int>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<unsigned_int> *)(local_98 + 0x20));
  return;
}

Assistant:

Impl(Capability::Client mainInterface, kj::StringPtr bindAddress, uint defaultPort,
       ReaderOptions readerOpts)
      : mainInterface(kj::mv(mainInterface)),
        context(EzRpcContext::getThreadLocal()), portPromise(nullptr), tasks(*this) {
    auto paf = kj::newPromiseAndFulfiller<uint>();
    portPromise = paf.promise.fork();

    tasks.add(context->getIoProvider().getNetwork().parseAddress(bindAddress, defaultPort)
        .then(kj::mvCapture(paf.fulfiller,
          [this, readerOpts](kj::Own<kj::PromiseFulfiller<uint>>&& portFulfiller,
                             kj::Own<kj::NetworkAddress>&& addr) {
      auto listener = addr->listen();
      portFulfiller->fulfill(listener->getPort());
      acceptLoop(kj::mv(listener), readerOpts);
    })));
  }